

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O1

void __thiscall spvtools::opt::LoopFusion::Fuse(LoopFusion *this)

{
  Loop **__src;
  pointer *pppLVar1;
  uint uVar2;
  Function *pFVar3;
  BasicBlock *this_00;
  BasicBlock *pBVar4;
  _func_int **pp_Var5;
  _func_int *p_Var6;
  Instruction *pIVar7;
  mapped_type pBVar8;
  IRContext *pIVar9;
  CFG *this_01;
  DefUseManager *this_02;
  pointer ppLVar10;
  Loop *pLVar11;
  Loop **ppLVar12;
  iterator __position;
  ulong uVar13;
  __node_base_ptr p_Var14;
  mapped_type pLVar15;
  undefined8 uVar16;
  iterator iVar17;
  bool bVar18;
  char cVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  BasicBlock *pBVar22;
  BasicBlock *pBVar23;
  mapped_type *ppBVar24;
  BasicBlock *pBVar25;
  Instruction *pIVar26;
  LoopDescriptor *this_03;
  __normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
  __dest;
  __node_base_ptr p_Var27;
  _Hash_node_base *p_Var28;
  Loop *pLVar29;
  mapped_type *ppLVar30;
  __normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
  __first;
  ulong uVar31;
  Instruction **phi_instruction;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> _Var32;
  code *pcVar33;
  __node_base_ptr p_Var34;
  Loop *loop;
  Instruction *pIVar35;
  Instruction *instruction;
  _Any_data *p_Var36;
  pointer ppLVar37;
  undefined8 uVar38;
  Loop *loop_2;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> UVar39;
  BasicBlockListTy loop_1_blocks;
  __alloc_node_gen_t __alloc_node_gen;
  _Any_data local_108;
  code *local_f8;
  code *pcStack_f0;
  undefined8 local_e8;
  size_t sStack_e0;
  undefined8 local_d8;
  _Any_data local_c8;
  code *local_b8;
  code *pcStack_b0;
  _AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,_false>_>_> local_a8;
  uint local_a0;
  uint local_9c;
  BasicBlock *local_98;
  uint local_8c;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_88;
  Instruction *pIStack_80;
  long local_78;
  Instruction *local_68;
  iterator iStack_60;
  Loop **local_58;
  uint32_t local_48;
  uint local_44;
  BasicBlock *local_40;
  BasicBlock *local_38;
  
  bVar18 = AreCompatible(this);
  if (!bVar18) {
    __assert_fail("AreCompatible() && \"Can\'t fuse, loops aren\'t compatible\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fusion.cpp"
                  ,0x216,"void spvtools::opt::LoopFusion::Fuse()");
  }
  bVar18 = IsLegal(this);
  if (!bVar18) {
    __assert_fail("IsLegal() && \"Can\'t fuse, illegal\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fusion.cpp"
                  ,0x217,"void spvtools::opt::LoopFusion::Fuse()");
  }
  pIVar26 = (this->loop_1_->loop_header_->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  local_a0 = 0;
  local_8c = 0;
  if (pIVar26->has_result_id_ == true) {
    local_8c = Instruction::GetSingleWordOperand(pIVar26,(uint)pIVar26->has_type_id_);
  }
  pBVar22 = Loop::FindConditionBlock(this->loop_1_);
  pIVar26 = (pBVar22->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar26->has_result_id_ == true) {
    local_a0 = Instruction::GetSingleWordOperand(pIVar26,(uint)pIVar26->has_type_id_);
  }
  pIVar26 = (this->loop_1_->loop_continue_->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar20 = 0;
  local_9c = 0;
  if (pIVar26->has_result_id_ == true) {
    local_9c = Instruction::GetSingleWordOperand(pIVar26,(uint)pIVar26->has_type_id_);
  }
  pIVar26 = (this->loop_0_->loop_continue_->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar26->has_result_id_ == true) {
    uVar20 = Instruction::GetSingleWordOperand(pIVar26,(uint)pIVar26->has_type_id_);
  }
  pBVar23 = Loop::FindConditionBlock(this->loop_0_);
  pFVar3 = this->containing_function_;
  UVar39 = std::
           __find_if<spvtools::opt::UptrVectorIterator<spvtools::opt::BasicBlock,false>,__gnu_cxx::__ops::_Iter_pred<spvtools::opt::Function::FindBlock(unsigned_int)::_lambda(spvtools::opt::BasicBlock_const&)_1_>>
                     (&pFVar3->blocks_,
                      (pFVar3->blocks_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,&pFVar3->blocks_,
                      (pFVar3->blocks_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,local_a0);
  pBVar22 = UVar39.iterator_._M_current._M_current[1]._M_t.
            super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
            .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
  pFVar3 = this->containing_function_;
  UVar39 = std::
           __find_if<spvtools::opt::UptrVectorIterator<spvtools::opt::BasicBlock,false>,__gnu_cxx::__ops::_Iter_pred<spvtools::opt::Function::FindBlock(unsigned_int)::_lambda(spvtools::opt::BasicBlock_const&)_1_>>
                     (&pFVar3->blocks_,
                      (pFVar3->blocks_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,&pFVar3->blocks_,
                      (pFVar3->blocks_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,local_9c);
  pBVar25 = UVar39.iterator_._M_current._M_current[-1]._M_t.
            super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
            .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
  pFVar3 = this->containing_function_;
  UVar39 = std::
           __find_if<spvtools::opt::UptrVectorIterator<spvtools::opt::BasicBlock,false>,__gnu_cxx::__ops::_Iter_pred<spvtools::opt::Function::FindBlock(unsigned_int)::_lambda(spvtools::opt::BasicBlock_const&)_1_>>
                     (&pFVar3->blocks_,
                      (pFVar3->blocks_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,&pFVar3->blocks_,
                      (pFVar3->blocks_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,uVar20);
  this_00 = UVar39.iterator_._M_current._M_current[-1]._M_t.
            super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
            .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
  local_108._8_8_ = 0;
  pcStack_f0 = std::
               _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fusion.cpp:551:7)>
               ::_M_invoke;
  local_f8 = std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fusion.cpp:551:7)>
             ::_M_manager;
  local_108._M_unused._M_object = pBVar22;
  BasicBlock::ForEachSuccessorLabel(this_00,(function<void_(unsigned_int_*)> *)&local_108);
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,3);
  }
  local_108._8_8_ = 0;
  pcStack_f0 = std::
               _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fusion.cpp:556:7)>
               ::_M_invoke;
  local_f8 = std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fusion.cpp:556:7)>
             ::_M_manager;
  local_108._M_unused._M_object = this;
  local_48 = uVar20;
  BasicBlock::ForEachSuccessorLabel(pBVar25,(function<void_(unsigned_int_*)> *)&local_108);
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,3);
  }
  pBVar4 = this->loop_0_->loop_header_;
  local_108._M_unused._M_object = &local_c8;
  local_c8._8_8_ = 0;
  pcStack_b0 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fusion.cpp:560:42)>
               ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fusion.cpp:560:42)>
             ::_M_manager;
  local_108._8_8_ = 0;
  pcStack_f0 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:295:7)>
               ::_M_invoke;
  local_f8 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:295:7)>
             ::_M_manager;
  pIVar26 = (pBVar4->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  local_c8._M_unused._M_object = this;
  if (pIVar26 != (Instruction *)0x0) {
    local_88._M_head_impl = pIVar26;
    std::
    _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fusion.cpp:560:42)>
    ::_M_invoke((_Any_data *)local_108._M_unused._0_8_,&local_88._M_head_impl);
  }
  pIVar26 = (pBVar4->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
            super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  local_98 = pBVar23;
  local_40 = pBVar22;
  local_38 = pBVar25;
  if ((pIVar26 != (Instruction *)0x0) &&
     ((pIVar26->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    do {
      if (pIVar26 == (Instruction *)0x0) break;
      pIVar35 = (pIVar26->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      local_88._M_head_impl = pIVar26;
      if (local_f8 == (code *)0x0) goto LAB_0027fb4b;
      if ((pIVar35->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar35 = (Instruction *)0x0;
      }
      cVar19 = (*pcStack_f0)(&local_108,(uint **)&local_88);
      pIVar26 = pIVar35;
    } while (cVar19 != '\0');
  }
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,3);
  }
  pBVar22 = local_98;
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,3);
  }
  local_c8._8_8_ = 0;
  pcStack_b0 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fusion.cpp:568:37)>
               ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fusion.cpp:568:37)>
             ::_M_manager;
  local_108._8_8_ = 0;
  local_108._M_unused._M_object = &local_c8;
  pcStack_f0 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:295:7)>
               ::_M_invoke;
  local_f8 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:295:7)>
             ::_M_manager;
  pIVar26 = (pBVar22->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  local_c8._M_unused._M_object = this;
  if (pIVar26 != (Instruction *)0x0) {
    local_88._M_head_impl = pIVar26;
    std::
    _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fusion.cpp:568:37)>
    ::_M_invoke((_Any_data *)local_108._M_unused._0_8_,&local_88._M_head_impl);
  }
  pIVar26 = (pBVar22->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
            super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if ((pIVar26 != (Instruction *)0x0) &&
     ((pIVar26->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    do {
      if (pIVar26 == (Instruction *)0x0) break;
      pIVar35 = (pIVar26->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      local_88._M_head_impl = pIVar26;
      if (local_f8 == (code *)0x0) goto LAB_0027fb4b;
      if ((pIVar35->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar35 = (Instruction *)0x0;
      }
      cVar19 = (*pcStack_f0)(&local_108,(uint **)&local_88);
      pIVar26 = pIVar35;
    } while (cVar19 != '\0');
  }
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,3);
  }
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,3);
  }
  local_88._M_head_impl = (Instruction *)0x0;
  pIStack_80 = (Instruction *)0x0;
  local_78 = 0;
  pBVar22 = this->loop_1_->loop_header_;
  p_Var36 = (_Any_data *)
            (pBVar22->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
            super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  pIVar26 = &(pBVar22->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  _Var32._M_head_impl = local_88._M_head_impl;
  if (p_Var36 != (_Any_data *)pIVar26) {
    do {
      if ((*(int *)((long)p_Var36 + 0x28) == 0xf5) && (p_Var36 != (_Any_data *)this->induction_1_))
      {
        local_108._M_unused._0_8_ = (undefined8)p_Var36;
        std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
        emplace_back<spvtools::opt::Instruction*>
                  ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                    *)&local_88,(Instruction **)&local_108);
      }
      p_Var36 = *(_Any_data **)(p_Var36->_M_pod_data + 8);
      _Var32._M_head_impl = local_88._M_head_impl;
    } while (p_Var36 != (_Any_data *)pIVar26);
  }
  for (; _Var32._M_head_impl != pIStack_80;
      _Var32._M_head_impl =
           (Instruction *)
           &((_Var32._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_)
  {
    pp_Var5 = ((_Var32._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
              _vptr_IntrusiveNodeBase;
    if (*(char *)(pp_Var5 + 3) == '\x01') {
      __assert_fail("!this->is_sentinel_ && \"Sentinel nodes cannot be moved around.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/ilist_node.h"
                    ,0xca,
                    "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList() [NodeType = spvtools::opt::Instruction]"
                   );
    }
    p_Var6 = pp_Var5[1];
    if (p_Var6 == (_func_int *)0x0) {
      __assert_fail("this->IsInAList() && \"Cannot remove a node from a list if it is not in a list.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/ilist_node.h"
                    ,0xcc,
                    "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList() [NodeType = spvtools::opt::Instruction]"
                   );
    }
    *(_func_int **)(p_Var6 + 0x10) = pp_Var5[2];
    *(_func_int **)(pp_Var5[2] + 8) = p_Var6;
    pp_Var5[1] = (_func_int *)0x0;
    pp_Var5[2] = (_func_int *)0x0;
    pIVar26 = (Instruction *)
              ((_Var32._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
              _vptr_IntrusiveNodeBase;
    if ((pIVar26->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == true) {
      __assert_fail("!this->is_sentinel_ && \"Sentinel nodes cannot be moved around.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/ilist_node.h"
                    ,0xae,
                    "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore(NodeType *) [NodeType = spvtools::opt::Instruction]"
                   );
    }
    pIVar35 = this->induction_0_;
    if ((pIVar35->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ ==
        (Instruction *)0x0) {
      __assert_fail("pos->IsInAList() && \"Pos should already be in a list.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/ilist_node.h"
                    ,0xaf,
                    "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore(NodeType *) [NodeType = spvtools::opt::Instruction]"
                   );
    }
    pIVar7 = (pIVar26->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    if (pIVar7 != (Instruction *)0x0) {
      (pIVar7->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
           (pIVar26->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
      (((pIVar26->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_)->
      super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar7;
      (pIVar26->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = (Instruction *)0x0
      ;
      (pIVar26->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
           (Instruction *)0x0;
    }
    (pIVar26->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar35;
    (pIVar26->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
         (pIVar35->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
    (pIVar35->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ = pIVar26;
    (((pIVar26->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_)->
    super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar26;
  }
  local_c8._8_8_ = 0;
  pcStack_b0 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fusion.cpp:596:45)>
               ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fusion.cpp:596:45)>
             ::_M_manager;
  local_108._8_8_ = 0;
  local_108._M_unused._M_object = &local_c8;
  pcStack_f0 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:332:7)>
               ::_M_invoke;
  local_f8 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:332:7)>
             ::_M_manager;
  pIVar26 = (this->loop_0_->loop_header_->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
            sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  local_c8._M_unused._M_object = this;
  if ((pIVar26 != (Instruction *)0x0) &&
     ((pIVar26->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    do {
      if (pIVar26 == (Instruction *)0x0) break;
      pIVar35 = (pIVar26->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      cVar19 = '\0';
      if ((pIVar35->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar35 = (Instruction *)0x0;
      }
      if (pIVar26->opcode_ == OpPhi) {
        local_68 = pIVar26;
        if (local_f8 == (code *)0x0) goto LAB_0027fb4b;
        cVar19 = (*pcStack_f0)(&local_108,(uint **)&local_68);
        if (cVar19 != '\0') {
          pIVar26 = pIVar35;
        }
      }
    } while (cVar19 != '\0');
  }
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,3);
  }
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,3);
  }
  pIVar26 = pIStack_80;
  if (local_88._M_head_impl != pIStack_80) {
    _Var32._M_head_impl = local_88._M_head_impl;
    do {
      local_108._M_unused._M_object =
           ((_Var32._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
           _vptr_IntrusiveNodeBase;
      pBVar8 = this->loop_0_->loop_header_;
      if ((this->context_->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
        ppBVar24 = std::__detail::
                   _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&this->context_->instr_to_block_,(key_type *)&local_108);
        *ppBVar24 = pBVar8;
      }
      pIVar9 = this->context_;
      if ((pIVar9->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(pIVar9);
      }
      analysis::DefUseManager::AnalyzeInstUse
                ((pIVar9->def_use_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                 _M_head_impl,
                 (Instruction *)
                 ((_Var32._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                 _vptr_IntrusiveNodeBase);
      _Var32._M_head_impl =
           (Instruction *)
           &((_Var32._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (_Var32._M_head_impl != pIVar26);
  }
  pIVar9 = this->context_;
  pIVar26 = this->induction_1_;
  uVar21 = 0;
  uVar20 = 0;
  if (pIVar26->has_result_id_ == true) {
    uVar20 = Instruction::GetSingleWordOperand(pIVar26,(uint)pIVar26->has_type_id_);
  }
  pIVar26 = this->induction_0_;
  if (pIVar26->has_result_id_ == true) {
    uVar21 = Instruction::GetSingleWordOperand(pIVar26,(uint)pIVar26->has_type_id_);
  }
  IRContext::ReplaceAllUsesWith(pIVar9,uVar20,uVar21);
  local_c8._8_8_ = 0;
  pcStack_b0 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fusion.cpp:616:44)>
               ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fusion.cpp:616:44)>
             ::_M_manager;
  local_108._8_8_ = 0;
  local_108._M_unused._M_object = &local_c8;
  pcStack_f0 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:332:7)>
               ::_M_invoke;
  local_f8 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:332:7)>
             ::_M_manager;
  pIVar26 = (this->loop_0_->loop_merge_->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
            sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  local_c8._M_unused._M_object = this;
  if ((pIVar26 != (Instruction *)0x0) &&
     ((pIVar26->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    do {
      if (pIVar26 == (Instruction *)0x0) break;
      pIVar35 = (pIVar26->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      cVar19 = '\0';
      if ((pIVar35->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar35 = (Instruction *)0x0;
      }
      if (pIVar26->opcode_ == OpPhi) {
        local_68 = pIVar26;
        if (local_f8 == (code *)0x0) goto LAB_0027fb4b;
        cVar19 = (*pcStack_f0)(&local_108,(uint **)&local_68);
        if (cVar19 != '\0') {
          pIVar26 = pIVar35;
        }
      }
    } while (cVar19 != '\0');
  }
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,3);
  }
  uVar20 = local_48;
  pBVar22 = local_98;
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,3);
  }
  local_c8._8_8_ = 0;
  local_c8._M_unused._M_object = pBVar22;
  pcStack_b0 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fusion.cpp:623:7)>
               ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fusion.cpp:623:7)>
             ::_M_manager;
  local_108._8_8_ = 0;
  local_108._M_unused._M_object = &local_c8;
  pcStack_f0 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:332:7)>
               ::_M_invoke;
  local_f8 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:332:7)>
             ::_M_manager;
  pIVar26 = (this->loop_1_->loop_merge_->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
            sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if ((pIVar26 != (Instruction *)0x0) &&
     ((pIVar26->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    do {
      if (pIVar26 == (Instruction *)0x0) break;
      pIVar35 = (pIVar26->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      cVar19 = '\0';
      if ((pIVar35->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar35 = (Instruction *)0x0;
      }
      if (pIVar26->opcode_ == OpPhi) {
        local_68 = pIVar26;
        if (local_f8 == (code *)0x0) {
LAB_0027fb4b:
          std::__throw_bad_function_call();
        }
        cVar19 = (*pcStack_f0)(&local_108,(uint **)&local_68);
        if (cVar19 != '\0') {
          pIVar26 = pIVar35;
        }
      }
    } while (cVar19 != '\0');
  }
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,3);
  }
  pBVar22 = local_38;
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,3);
  }
  Function::MoveBasicBlockToAfter(this->containing_function_,uVar20,pBVar22);
  local_c8._M_unused._M_object = (undefined8 *)0x0;
  local_c8._8_8_ = (_func_void *)0x0;
  local_b8 = (code *)0x0;
  anon_unknown_21::AddInstructionsInBlock
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &local_c8,this->loop_1_->loop_preheader_);
  anon_unknown_21::AddInstructionsInBlock
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &local_c8,this->loop_1_->loop_header_);
  pBVar25 = Loop::FindConditionBlock(this->loop_1_);
  anon_unknown_21::AddInstructionsInBlock
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &local_c8,pBVar25);
  anon_unknown_21::AddInstructionsInBlock
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &local_c8,this->loop_1_->loop_continue_);
  pBVar25 = this->loop_0_->loop_merge_;
  if (pBVar25 != this->loop_1_->loop_preheader_) {
    anon_unknown_21::AddInstructionsInBlock
              ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)&local_c8,pBVar25);
  }
  pBVar25 = local_98;
  pIVar9 = this->context_;
  if ((pIVar9->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(pIVar9);
  }
  this_01 = (pIVar9->cfg_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t
            .super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
            super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  CFG::ForgetBlock(this_01,this->loop_1_->loop_preheader_);
  CFG::ForgetBlock(this_01,this->loop_1_->loop_header_);
  pBVar23 = Loop::FindConditionBlock(this->loop_1_);
  CFG::ForgetBlock(this_01,pBVar23);
  CFG::ForgetBlock(this_01,this->loop_1_->loop_continue_);
  pBVar23 = this->loop_0_->loop_merge_;
  if (pBVar23 != this->loop_1_->loop_preheader_) {
    CFG::ForgetBlock(this_01,pBVar23);
  }
  pIVar26 = (this_00->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar21 = 0;
  uVar20 = 0;
  if (pIVar26->has_result_id_ == true) {
    uVar20 = Instruction::GetSingleWordOperand(pIVar26,(uint)pIVar26->has_type_id_);
  }
  pIVar26 = (this->loop_0_->loop_continue_->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar26->has_result_id_ == true) {
    uVar21 = Instruction::GetSingleWordOperand(pIVar26,(uint)pIVar26->has_type_id_);
  }
  CFG::RemoveEdge(this_01,uVar20,uVar21);
  pIVar26 = (this_00->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar21 = 0;
  uVar20 = 0;
  if (pIVar26->has_result_id_ == true) {
    uVar20 = Instruction::GetSingleWordOperand(pIVar26,(uint)pIVar26->has_type_id_);
  }
  pIVar26 = (local_40->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar26->has_result_id_ == true) {
    uVar21 = Instruction::GetSingleWordOperand(pIVar26,(uint)pIVar26->has_type_id_);
  }
  CFG::AddEdge(this_01,uVar20,uVar21);
  pIVar26 = (pBVar22->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar21 = 0;
  uVar20 = 0;
  if (pIVar26->has_result_id_ == true) {
    uVar20 = Instruction::GetSingleWordOperand(pIVar26,(uint)pIVar26->has_type_id_);
  }
  pIVar26 = (this->loop_0_->loop_continue_->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar26->has_result_id_ == true) {
    uVar21 = Instruction::GetSingleWordOperand(pIVar26,(uint)pIVar26->has_type_id_);
  }
  CFG::AddEdge(this_01,uVar20,uVar21);
  pIVar26 = (this->loop_0_->loop_continue_->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar21 = 0;
  uVar20 = 0;
  if (pIVar26->has_result_id_ == true) {
    uVar20 = Instruction::GetSingleWordOperand(pIVar26,(uint)pIVar26->has_type_id_);
  }
  pIVar26 = (this->loop_1_->loop_header_->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar26->has_result_id_ == true) {
    uVar21 = Instruction::GetSingleWordOperand(pIVar26,(uint)pIVar26->has_type_id_);
  }
  CFG::AddEdge(this_01,uVar20,uVar21);
  pIVar26 = (pBVar25->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar21 = 0;
  uVar20 = 0;
  if (pIVar26->has_result_id_ == true) {
    uVar20 = Instruction::GetSingleWordOperand(pIVar26,(uint)pIVar26->has_type_id_);
  }
  pIVar26 = (this->loop_1_->loop_merge_->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar26->has_result_id_ == true) {
    uVar21 = Instruction::GetSingleWordOperand(pIVar26,(uint)pIVar26->has_type_id_);
  }
  CFG::AddEdge(this_01,uVar20,uVar21);
  pIVar9 = this->context_;
  if ((pIVar9->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar9);
  }
  pIVar26 = (this_00->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
            super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if ((pIVar26 != (Instruction *)0x0) &&
     ((pIVar26->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    this_02 = (pIVar9->def_use_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    analysis::DefUseManager::AnalyzeInstUse
              (this_02,(this_00->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                       super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_);
    pIVar26 = (pBVar22->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
              super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    if ((pIVar26 != (Instruction *)0x0) &&
       ((pIVar26->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
      analysis::DefUseManager::AnalyzeInstUse
                (this_02,(pBVar22->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_
                         .super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_);
      pIVar26 = BasicBlock::GetLoopMergeInst(this->loop_0_->loop_header_);
      analysis::DefUseManager::AnalyzeInstUse(this_02,pIVar26);
      pIVar26 = (pBVar25->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
      if ((pIVar26 != (Instruction *)0x0) &&
         ((pIVar26->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
        analysis::DefUseManager::AnalyzeInstUse
                  (this_02,(pBVar25->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
                           sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.
                           previous_node_);
        this_03 = IRContext::GetLoopDescriptor(this->context_,this->containing_function_);
        local_68 = (Instruction *)0x0;
        iStack_60._M_current = (Loop **)0x0;
        local_58 = (Loop **)0x0;
        ppLVar37 = (this->loop_1_->nested_loops_).
                   super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppLVar10 = (this->loop_1_->nested_loops_).
                   super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if (ppLVar37 != ppLVar10) {
          do {
            local_108._M_unused._M_object = *ppLVar37;
            if (iStack_60._M_current == local_58) {
              std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>::
              _M_realloc_insert<spvtools::opt::Loop*const&>
                        ((vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>> *)
                         &local_68,iStack_60,(Loop **)&local_108);
            }
            else {
              *iStack_60._M_current = (Loop *)local_108._M_unused._0_8_;
              iStack_60._M_current = iStack_60._M_current + 1;
            }
            ppLVar37 = ppLVar37 + 1;
          } while (ppLVar37 != ppLVar10);
        }
        iVar17._M_current = iStack_60._M_current;
        if (local_68 != (Instruction *)iStack_60._M_current) {
          pIVar26 = local_68;
          do {
            pLVar29 = (Loop *)(pIVar26->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                              _vptr_IntrusiveNodeBase;
            pLVar11 = this->loop_1_;
            local_108._M_unused._0_8_ = (undefined8)pLVar29;
            __dest = std::
                     __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>,__gnu_cxx::__ops::_Iter_equals_val<spvtools::opt::Loop*const>>
                               ((pLVar11->nested_loops_).
                                super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (pLVar11->nested_loops_).
                                super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish,&local_108);
            __src = __dest._M_current + 1;
            ppLVar12 = (pLVar11->nested_loops_).
                       super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            if (__src != ppLVar12) {
              memmove(__dest._M_current,__src,(long)ppLVar12 - (long)__src);
            }
            pppLVar1 = &(pLVar11->nested_loops_).
                        super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppLVar1 = *pppLVar1 + -1;
            *(Loop **)(local_108._M_unused._M_function_pointer + 0x30) = (Loop *)0x0;
            pLVar11 = this->loop_0_;
            if (pLVar29->parent_ != (Loop *)0x0) {
              local_108._M_unused._0_8_ = (undefined8)pLVar29;
              __assert_fail("!nested->GetParent() && \"The loop has another parent.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.h"
                            ,0xaa,"void spvtools::opt::Loop::AddNestedLoop(Loop *)");
            }
            __position._M_current =
                 (pLVar11->nested_loops_).
                 super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (pLVar11->nested_loops_).
                super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_108._M_unused._0_8_ = (undefined8)pLVar29;
              std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>::
              _M_realloc_insert<spvtools::opt::Loop*const&>
                        ((vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>> *)
                         &pLVar11->nested_loops_,__position,(Loop **)&local_108);
            }
            else {
              *__position._M_current = pLVar29;
              pppLVar1 = &(pLVar11->nested_loops_).
                          super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppLVar1 = *pppLVar1 + 1;
              local_108._M_unused._0_8_ = pLVar29;
            }
            *(Loop **)(local_108._M_unused._M_function_pointer + 0x30) = pLVar11;
            pIVar26 = (Instruction *)
                      &(pIVar26->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
          } while (pIVar26 != (Instruction *)iVar17._M_current);
        }
        pLVar29 = this->loop_1_;
        local_108._M_unused._M_object = (void *)0x0;
        local_108._8_8_ = (pLVar29->loop_basic_blocks_)._M_h._M_bucket_count;
        local_f8 = (code *)0x0;
        pcStack_f0 = (code *)(pLVar29->loop_basic_blocks_)._M_h._M_element_count;
        local_e8 = *(undefined8 *)&(pLVar29->loop_basic_blocks_)._M_h._M_rehash_policy;
        sStack_e0 = (pLVar29->loop_basic_blocks_)._M_h._M_rehash_policy._M_next_resize;
        local_d8 = 0;
        local_a8._M_h = (__hashtable_alloc *)&local_108;
        std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_assign<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_a8._M_h,&(pLVar29->loop_basic_blocks_)._M_h,&local_a8);
        if (local_f8 != (code *)0x0) {
          local_98 = (BasicBlock *)&this_03->basic_block_to_loop_;
          pcVar33 = local_f8;
          do {
            uVar2 = *(uint *)((long)pcVar33 + 8);
            pLVar29 = this->loop_1_;
            local_a8._M_h._0_4_ = uVar2;
            do {
              std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::_M_erase(&(pLVar29->loop_basic_blocks_)._M_h,&local_a8);
              pLVar29 = pLVar29->parent_;
            } while (pLVar29 != (Loop *)0x0);
            if (((uVar2 != local_9c) && (uVar2 != local_8c)) && (uVar2 != local_a0)) {
              pLVar29 = this->loop_0_;
              local_44 = uVar2;
              do {
                local_a8._M_h = (__hashtable_alloc *)&pLVar29->loop_basic_blocks_;
                std::
                _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::
                _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                          ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)local_a8._M_h,&local_44,&local_a8);
                pLVar29 = pLVar29->parent_;
              } while (pLVar29 != (Loop *)0x0);
              uVar13 = (this_03->basic_block_to_loop_)._M_h._M_bucket_count;
              uVar31 = (ulong)uVar2 % uVar13;
              p_Var14 = (this_03->basic_block_to_loop_)._M_h._M_buckets[uVar31];
              p_Var27 = (__node_base_ptr)0x0;
              if ((p_Var14 != (__node_base_ptr)0x0) &&
                 (p_Var27 = p_Var14, p_Var34 = p_Var14->_M_nxt,
                 *(uint *)&p_Var14->_M_nxt[1]._M_nxt != uVar2)) {
                while (p_Var28 = p_Var34->_M_nxt, p_Var28 != (_Hash_node_base *)0x0) {
                  p_Var27 = (__node_base_ptr)0x0;
                  if (((ulong)*(uint *)&p_Var28[1]._M_nxt % uVar13 != uVar31) ||
                     (p_Var27 = p_Var34, p_Var34 = p_Var28, *(uint *)&p_Var28[1]._M_nxt == uVar2))
                  goto LAB_0027f88f;
                }
                p_Var27 = (__node_base_ptr)0x0;
              }
LAB_0027f88f:
              if (p_Var27 == (__node_base_ptr)0x0) {
                p_Var28 = (_Hash_node_base *)0x0;
              }
              else {
                p_Var28 = p_Var27->_M_nxt;
              }
              if (p_Var28 == (_Hash_node_base *)0x0) {
                pLVar29 = (Loop *)0x0;
              }
              else {
                pLVar29 = (Loop *)p_Var28[2]._M_nxt;
              }
              if (pLVar29 == this->loop_1_) {
                pLVar15 = this->loop_0_;
                ppLVar30 = std::__detail::
                           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)local_98,(key_type *)&local_a8);
                *ppLVar30 = pLVar15;
              }
            }
            uVar13 = (this_03->basic_block_to_loop_)._M_h._M_bucket_count;
            uVar31 = (ulong)uVar2 % uVar13;
            p_Var14 = (this_03->basic_block_to_loop_)._M_h._M_buckets[uVar31];
            p_Var27 = (__node_base_ptr)0x0;
            if ((p_Var14 != (__node_base_ptr)0x0) &&
               (p_Var27 = p_Var14, p_Var34 = p_Var14->_M_nxt,
               *(uint *)&p_Var14->_M_nxt[1]._M_nxt != uVar2)) {
              while (p_Var28 = p_Var34->_M_nxt, p_Var28 != (_Hash_node_base *)0x0) {
                p_Var27 = (__node_base_ptr)0x0;
                if (((ulong)*(uint *)&p_Var28[1]._M_nxt % uVar13 != uVar31) ||
                   (p_Var27 = p_Var34, p_Var34 = p_Var28, *(uint *)&p_Var28[1]._M_nxt == uVar2))
                goto LAB_0027f92f;
              }
              p_Var27 = (__node_base_ptr)0x0;
            }
LAB_0027f92f:
            if (p_Var27 == (__node_base_ptr)0x0) {
              p_Var28 = (_Hash_node_base *)0x0;
            }
            else {
              p_Var28 = p_Var27->_M_nxt;
            }
            if (p_Var28 == (_Hash_node_base *)0x0) {
              pLVar29 = (Loop *)0x0;
            }
            else {
              pLVar29 = (Loop *)p_Var28[2]._M_nxt;
            }
            if (pLVar29 == this->loop_1_) {
              std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::_M_erase((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)local_98,&local_a8);
            }
            pcVar33 = *(code **)pcVar33;
          } while (pcVar33 != (code *)0x0);
        }
        pLVar29 = this->loop_1_;
        pIVar26 = (pLVar29->loop_preheader_->label_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        uVar20 = 0;
        if (pIVar26->has_result_id_ == true) {
          uVar20 = Instruction::GetSingleWordOperand(pIVar26,(uint)pIVar26->has_type_id_);
        }
        local_a8._M_h._0_4_ = uVar20;
        do {
          std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_M_erase(&(pLVar29->loop_basic_blocks_)._M_h,&local_a8);
          pLVar29 = pLVar29->parent_;
        } while (pLVar29 != (Loop *)0x0);
        pIVar26 = (this->loop_1_->loop_preheader_->label_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        uVar20 = 0;
        if (pIVar26->has_result_id_ == true) {
          uVar20 = Instruction::GetSingleWordOperand(pIVar26,(uint)pIVar26->has_type_id_);
        }
        local_a8._M_h._0_4_ = uVar20;
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::_M_erase(&(this_03->basic_block_to_loop_)._M_h);
        pLVar29 = this->loop_0_;
        if (pLVar29->loop_merge_ != this->loop_1_->loop_preheader_) {
          pIVar26 = (pLVar29->loop_merge_->label_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
          uVar20 = 0;
          if (pIVar26->has_result_id_ == true) {
            uVar20 = Instruction::GetSingleWordOperand(pIVar26,(uint)pIVar26->has_type_id_);
          }
          local_a8._M_h._0_4_ = uVar20;
          do {
            std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::_M_erase(&(pLVar29->loop_basic_blocks_)._M_h,&local_a8);
            pLVar29 = pLVar29->parent_;
          } while (pLVar29 != (Loop *)0x0);
          pIVar26 = (this->loop_0_->loop_merge_->label_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
          uVar20 = 0;
          if (pIVar26->has_result_id_ == true) {
            uVar20 = Instruction::GetSingleWordOperand(pIVar26,(uint)pIVar26->has_type_id_);
          }
          local_a8._M_h._0_4_ = uVar20;
          std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::_M_erase(&(this_03->basic_block_to_loop_)._M_h);
        }
        Loop::SetMergeBlock(this->loop_0_,this->loop_1_->loop_merge_);
        std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::clear(&(this->loop_1_->loop_basic_blocks_)._M_h);
        LoopDescriptor::RemoveLoop(this_03,this->loop_1_);
        uVar16 = local_c8._8_8_;
        for (uVar38 = local_c8._M_unused._0_8_; uVar38 != uVar16; uVar38 = uVar38 + 8) {
          IRContext::KillInst(this->context_,*(Instruction **)uVar38);
        }
        pFVar3 = this->containing_function_;
        __first = std::
                  __remove_if<__gnu_cxx::__normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>*,std::vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>>,__gnu_cxx::__ops::_Iter_pred<spvtools::opt::Function::RemoveEmptyBlocks()::_lambda(std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>const&)_1_>>
                            ((pFVar3->blocks_).
                             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (pFVar3->blocks_).
                             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
        std::
        vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
        ::_M_erase(&pFVar3->blocks_,(iterator)__first._M_current,
                   (pFVar3->blocks_).
                   super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        IRContext::InvalidateAnalysesExceptFor
                  (this->context_,
                   kAnalysisLoopAnalysis|kAnalysisCFG|kAnalysisInstrToBlockMapping|kAnalysisBegin);
        std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)&local_108);
        if (local_68 != (Instruction *)0x0) {
          operator_delete(local_68,(long)local_58 - (long)local_68);
        }
        if ((_func_void *)local_c8._M_unused._0_8_ != (_func_void *)0x0) {
          operator_delete(local_c8._M_unused._M_object,(long)local_b8 - local_c8._0_8_);
        }
        if (local_88._M_head_impl != (Instruction *)0x0) {
          operator_delete(local_88._M_head_impl,local_78 - (long)local_88._M_head_impl);
        }
        return;
      }
    }
  }
  __assert_fail("!insts_.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h"
                ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
}

Assistant:

void LoopFusion::Fuse() {
  assert(AreCompatible() && "Can't fuse, loops aren't compatible");
  assert(IsLegal() && "Can't fuse, illegal");

  // Save the pointers/ids, won't be found in the middle of doing modifications.
  auto header_1 = loop_1_->GetHeaderBlock()->id();
  auto condition_1 = loop_1_->FindConditionBlock()->id();
  auto continue_1 = loop_1_->GetContinueBlock()->id();
  auto continue_0 = loop_0_->GetContinueBlock()->id();
  auto condition_block_of_0 = loop_0_->FindConditionBlock();

  // Find the blocks whose branches need updating.
  auto first_block_of_1 = &*(++containing_function_->FindBlock(condition_1));
  auto last_block_of_1 = &*(--containing_function_->FindBlock(continue_1));
  auto last_block_of_0 = &*(--containing_function_->FindBlock(continue_0));

  // Update the branch for |last_block_of_loop_0| to go to |first_block_of_1|.
  last_block_of_0->ForEachSuccessorLabel(
      [first_block_of_1](uint32_t* succ) { *succ = first_block_of_1->id(); });

  // Update the branch for the |last_block_of_loop_1| to go to the continue
  // block of |loop_0_|.
  last_block_of_1->ForEachSuccessorLabel(
      [this](uint32_t* succ) { *succ = loop_0_->GetContinueBlock()->id(); });

  // Update merge block id in the header of |loop_0_| to the merge block of
  // |loop_1_|.
  loop_0_->GetHeaderBlock()->ForEachInst([this](Instruction* inst) {
    if (inst->opcode() == spv::Op::OpLoopMerge) {
      inst->SetInOperand(0, {loop_1_->GetMergeBlock()->id()});
    }
  });

  // Update condition branch target in |loop_0_| to the merge block of
  // |loop_1_|.
  condition_block_of_0->ForEachInst([this](Instruction* inst) {
    if (inst->opcode() == spv::Op::OpBranchConditional) {
      auto loop_0_merge_block_id = loop_0_->GetMergeBlock()->id();

      if (inst->GetSingleWordInOperand(1) == loop_0_merge_block_id) {
        inst->SetInOperand(1, {loop_1_->GetMergeBlock()->id()});
      } else {
        inst->SetInOperand(2, {loop_1_->GetMergeBlock()->id()});
      }
    }
  });

  // Move OpPhi instructions not corresponding to the induction variable from
  // the header of |loop_1_| to the header of |loop_0_|.
  std::vector<Instruction*> instructions_to_move{};
  for (auto& instruction : *loop_1_->GetHeaderBlock()) {
    if (instruction.opcode() == spv::Op::OpPhi &&
        &instruction != induction_1_) {
      instructions_to_move.push_back(&instruction);
    }
  }

  for (auto& it : instructions_to_move) {
    it->RemoveFromList();
    it->InsertBefore(induction_0_);
  }

  // Update the OpPhi parents to the correct blocks in |loop_0_|.
  loop_0_->GetHeaderBlock()->ForEachPhiInst([this](Instruction* i) {
    ReplacePhiParentWith(i, loop_1_->GetPreHeaderBlock()->id(),
                         loop_0_->GetPreHeaderBlock()->id());

    ReplacePhiParentWith(i, loop_1_->GetContinueBlock()->id(),
                         loop_0_->GetContinueBlock()->id());
  });

  // Update instruction to block mapping & DefUseManager.
  for (auto& phi_instruction : instructions_to_move) {
    context_->set_instr_block(phi_instruction, loop_0_->GetHeaderBlock());
    context_->get_def_use_mgr()->AnalyzeInstUse(phi_instruction);
  }

  // Replace the uses of the induction variable of |loop_1_| with that the
  // induction variable of |loop_0_|.
  context_->ReplaceAllUsesWith(induction_1_->result_id(),
                               induction_0_->result_id());

  // Replace LCSSA OpPhi in merge block of |loop_0_|.
  loop_0_->GetMergeBlock()->ForEachPhiInst([this](Instruction* instruction) {
    context_->ReplaceAllUsesWith(instruction->result_id(),
                                 instruction->GetSingleWordInOperand(0));
  });

  // Update LCSSA OpPhi in merge block of |loop_1_|.
  loop_1_->GetMergeBlock()->ForEachPhiInst(
      [condition_block_of_0](Instruction* instruction) {
        instruction->SetInOperand(1, {condition_block_of_0->id()});
      });

  // Move the continue block of |loop_0_| after the last block of |loop_1_|.
  containing_function_->MoveBasicBlockToAfter(continue_0, last_block_of_1);

  // Gather all instructions to be killed from |loop_1_| (induction variable
  // initialisation, header, condition and continue blocks).
  std::vector<Instruction*> instr_to_delete{};
  AddInstructionsInBlock(&instr_to_delete, loop_1_->GetPreHeaderBlock());
  AddInstructionsInBlock(&instr_to_delete, loop_1_->GetHeaderBlock());
  AddInstructionsInBlock(&instr_to_delete, loop_1_->FindConditionBlock());
  AddInstructionsInBlock(&instr_to_delete, loop_1_->GetContinueBlock());

  // There was an additional empty block between the loops, kill that too.
  if (loop_0_->GetMergeBlock() != loop_1_->GetPreHeaderBlock()) {
    AddInstructionsInBlock(&instr_to_delete, loop_0_->GetMergeBlock());
  }

  // Update the CFG, so it wouldn't need invalidating.
  auto cfg = context_->cfg();

  cfg->ForgetBlock(loop_1_->GetPreHeaderBlock());
  cfg->ForgetBlock(loop_1_->GetHeaderBlock());
  cfg->ForgetBlock(loop_1_->FindConditionBlock());
  cfg->ForgetBlock(loop_1_->GetContinueBlock());

  if (loop_0_->GetMergeBlock() != loop_1_->GetPreHeaderBlock()) {
    cfg->ForgetBlock(loop_0_->GetMergeBlock());
  }

  cfg->RemoveEdge(last_block_of_0->id(), loop_0_->GetContinueBlock()->id());
  cfg->AddEdge(last_block_of_0->id(), first_block_of_1->id());

  cfg->AddEdge(last_block_of_1->id(), loop_0_->GetContinueBlock()->id());

  cfg->AddEdge(loop_0_->GetContinueBlock()->id(),
               loop_1_->GetHeaderBlock()->id());

  cfg->AddEdge(condition_block_of_0->id(), loop_1_->GetMergeBlock()->id());

  // Update DefUseManager.
  auto def_use_mgr = context_->get_def_use_mgr();

  // Uses of labels that are in updated branches need analysing.
  def_use_mgr->AnalyzeInstUse(last_block_of_0->terminator());
  def_use_mgr->AnalyzeInstUse(last_block_of_1->terminator());
  def_use_mgr->AnalyzeInstUse(loop_0_->GetHeaderBlock()->GetLoopMergeInst());
  def_use_mgr->AnalyzeInstUse(condition_block_of_0->terminator());

  // Update the LoopDescriptor, so it wouldn't need invalidating.
  auto ld = context_->GetLoopDescriptor(containing_function_);

  // Create a copy, so the iterator wouldn't be invalidated.
  std::vector<Loop*> loops_to_add_remove{};
  for (auto child_loop : *loop_1_) {
    loops_to_add_remove.push_back(child_loop);
  }

  for (auto child_loop : loops_to_add_remove) {
    loop_1_->RemoveChildLoop(child_loop);
    loop_0_->AddNestedLoop(child_loop);
  }

  auto loop_1_blocks = loop_1_->GetBlocks();

  for (auto block : loop_1_blocks) {
    loop_1_->RemoveBasicBlock(block);
    if (block != header_1 && block != condition_1 && block != continue_1) {
      loop_0_->AddBasicBlock(block);
      if ((*ld)[block] == loop_1_) {
        ld->SetBasicBlockToLoop(block, loop_0_);
      }
    }

    if ((*ld)[block] == loop_1_) {
      ld->ForgetBasicBlock(block);
    }
  }

  loop_1_->RemoveBasicBlock(loop_1_->GetPreHeaderBlock()->id());
  ld->ForgetBasicBlock(loop_1_->GetPreHeaderBlock()->id());

  if (loop_0_->GetMergeBlock() != loop_1_->GetPreHeaderBlock()) {
    loop_0_->RemoveBasicBlock(loop_0_->GetMergeBlock()->id());
    ld->ForgetBasicBlock(loop_0_->GetMergeBlock()->id());
  }

  loop_0_->SetMergeBlock(loop_1_->GetMergeBlock());

  loop_1_->ClearBlocks();

  ld->RemoveLoop(loop_1_);

  // Kill unnecessary instructions and remove all empty blocks.
  for (auto inst : instr_to_delete) {
    context_->KillInst(inst);
  }

  containing_function_->RemoveEmptyBlocks();

  // Invalidate analyses.
  context_->InvalidateAnalysesExceptFor(
      IRContext::Analysis::kAnalysisInstrToBlockMapping |
      IRContext::Analysis::kAnalysisLoopAnalysis |
      IRContext::Analysis::kAnalysisDefUse | IRContext::Analysis::kAnalysisCFG);
}